

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor *
ggml_im2col(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,int s0,int s1,int p0,int p1,int d0,
           int d1,_Bool is_2D,ggml_type dst_type)

{
  ggml_tensor *tensor;
  char *pcVar1;
  int line;
  long lVar2;
  int32_t params [7];
  long local_58;
  long local_50;
  int64_t local_48;
  int64_t local_40;
  
  if (is_2D) {
    if (a->ne[2] != b->ne[2]) {
      pcVar1 = "a->ne[2] == b->ne[2]";
      line = 0xefc;
      goto LAB_00122f47;
    }
    local_58 = a->ne[1];
    local_48 = (~((local_58 + -1) * (long)d1) + (long)(p1 * 2) + b->ne[1]) / (long)s1 + 1;
  }
  else {
    local_58 = b->ne[1];
    if (local_58 != a->ne[1]) {
      pcVar1 = "b->ne[1] == a->ne[1]";
      line = 0xeff;
      goto LAB_00122f47;
    }
    if (b->ne[3] != 1) {
      pcVar1 = "b->ne[3] == 1";
      line = 0xf00;
      goto LAB_00122f47;
    }
    local_48 = 0;
  }
  lVar2 = a->ne[0];
  local_50 = (~((lVar2 + -1) * (long)d0) + (long)(p0 * 2) + b->ne[0]) / (long)s0;
  if ((is_2D) && (local_48 < 1)) {
    pcVar1 = "(!is_2D || OH > 0) && \"b too small compared to a\"";
    line = 0xf06;
  }
  else {
    if (-1 < local_50) {
      if (is_2D) {
        lVar2 = lVar2 * a->ne[2];
        local_40 = b->ne[3];
      }
      else {
        local_48 = b->ne[2];
        local_40 = 1;
      }
      local_58 = local_58 * lVar2;
      local_50 = local_50 + 1;
      tensor = ggml_new_tensor(ctx,dst_type,4,&local_58);
      params[3] = p1;
      params[4] = d0;
      params[5] = d1;
      params[6] = (int32_t)is_2D;
      params[0] = s0;
      params[1] = s1;
      params[2] = p0;
      ggml_set_op_params(tensor,params,0x1c);
      tensor->op = GGML_OP_IM2COL;
      tensor->src[0] = a;
      tensor->src[1] = b;
      return tensor;
    }
    pcVar1 = "(OW > 0) && \"b too small compared to a\"";
    line = 0xf07;
  }
LAB_00122f47:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",line,
             "GGML_ASSERT(%s) failed",pcVar1);
}

Assistant:

struct ggml_tensor * ggml_im2col(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        int                   s0,
        int                   s1,
        int                   p0,
        int                   p1,
        int                   d0,
        int                   d1,
        bool                  is_2D,
        enum ggml_type        dst_type) {
    if (is_2D) {
        GGML_ASSERT(a->ne[2] == b->ne[2]);
    } else {
        //GGML_ASSERT(b->ne[1] % a->ne[1] == 0);
        GGML_ASSERT(b->ne[1] == a->ne[1]);
        GGML_ASSERT(b->ne[3] == 1);
    }

    const int64_t OH = is_2D ? ggml_calc_conv_output_size(b->ne[1], a->ne[1], s1, p1, d1) : 0;
    const int64_t OW =         ggml_calc_conv_output_size(b->ne[0], a->ne[0], s0, p0, d0);

    GGML_ASSERT((!is_2D || OH > 0) && "b too small compared to a");
    GGML_ASSERT((OW > 0)           && "b too small compared to a");

    const int64_t ne[4] = {
        is_2D ? (a->ne[2] * a->ne[1] * a->ne[0]) : a->ne[1] * a->ne[0],
        OW,
        is_2D ? OH : b->ne[2],
        is_2D ?      b->ne[3] : 1,
    };

    struct ggml_tensor * result = ggml_new_tensor(ctx, dst_type, 4, ne);
    int32_t params[] = { s0, s1, p0, p1, d0, d1, (is_2D ? 1 : 0) };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_IM2COL;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}